

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O3

void BinarySink_put_fxp_attrs(BinarySink *bs,fxp_attrs attrs)

{
  BinarySink_put_uint32(bs->binarysink_,attrs.flags);
  if (((undefined1  [56])attrs & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    BinarySink_put_uint64(bs->binarysink_,attrs.size);
  }
  if (((undefined1  [56])attrs & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
    BinarySink_put_uint32(bs->binarysink_,attrs.uid);
    BinarySink_put_uint32(bs->binarysink_,attrs.gid);
  }
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    BinarySink_put_uint32(bs->binarysink_,attrs.permissions);
  }
  if (((undefined1  [56])attrs & (undefined1  [56])0x8) == (undefined1  [56])0x0) {
    return;
  }
  BinarySink_put_uint32(bs->binarysink_,attrs.atime);
  BinarySink_put_uint32(bs->binarysink_,attrs.mtime);
  return;
}

Assistant:

void BinarySink_put_fxp_attrs(BinarySink *bs, struct fxp_attrs attrs)
{
    put_uint32(bs, attrs.flags);
    if (attrs.flags & SSH_FILEXFER_ATTR_SIZE)
        put_uint64(bs, attrs.size);
    if (attrs.flags & SSH_FILEXFER_ATTR_UIDGID) {
        put_uint32(bs, attrs.uid);
        put_uint32(bs, attrs.gid);
    }
    if (attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) {
        put_uint32(bs, attrs.permissions);
    }
    if (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME) {
        put_uint32(bs, attrs.atime);
        put_uint32(bs, attrs.mtime);
    }
    if (attrs.flags & SSH_FILEXFER_ATTR_EXTENDED) {
        /*
         * We currently don't support sending any extended
         * attributes.
         */
    }
}